

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

FString * __thiscall FString::operator=(FString *this,FString *other)

{
  FStringData *this_00;
  int oldrefcount;
  FString *other_local;
  FString *this_local;
  
  if (this->Chars == (char *)0x0) {
    __assert_fail("Chars != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                  ,0xc9,"FString &FString::operator=(const FString &)");
  }
  if (other != this) {
    Data(this);
    this_00 = Data(this);
    FStringData::Release(this_00);
    AttachToOther(this,other);
  }
  return this;
}

Assistant:

FString &FString::operator = (const FString &other)
{
	assert (Chars != NULL);

	if (&other != this)
	{
		int oldrefcount = Data()->RefCount < 0;
		Data()->Release();
		AttachToOther(other);
		if (oldrefcount < 0)
		{
			LockBuffer();
			Data()->RefCount = oldrefcount;
		}
	}
	return *this;
}